

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::CanHaveArgOutChain(Instr *this)

{
  bool local_11;
  Instr *this_local;
  
  local_11 = true;
  if ((((this->m_opcode != CallI) && (local_11 = true, this->m_opcode != CallIFixed)) &&
      (local_11 = true, this->m_opcode != NewScObject)) &&
     ((local_11 = true, this->m_opcode != NewScObjectSpread &&
      (local_11 = true, this->m_opcode != NewScObjArray)))) {
    local_11 = this->m_opcode == NewScObjArraySpread;
  }
  return local_11;
}

Assistant:

bool Instr::CanHaveArgOutChain() const
{
    return
        this->m_opcode == Js::OpCode::CallI ||
        this->m_opcode == Js::OpCode::CallIFixed ||
        this->m_opcode == Js::OpCode::NewScObject ||
        this->m_opcode == Js::OpCode::NewScObjectSpread ||
        this->m_opcode == Js::OpCode::NewScObjArray ||
        this->m_opcode == Js::OpCode::NewScObjArraySpread;
}